

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.c
# Opt level: O1

void al_fill_silence(void *buf,uint samples,ALLEGRO_AUDIO_DEPTH depth,ALLEGRO_CHANNEL_CONF chan_conf
                    )

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long lVar3;
  long lVar4;
  int iVar7;
  undefined1 auVar5 [16];
  int iVar8;
  undefined1 auVar6 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  int iVar26;
  int iVar29;
  undefined1 auVar27 [16];
  int iVar30;
  undefined1 auVar28 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar31 [16];
  undefined1 in_XMM12 [16];
  
  auVar1 = _DAT_00112020;
  if (depth < (ALLEGRO_AUDIO_DEPTH_UINT24|ALLEGRO_AUDIO_DEPTH_INT16)) {
    uVar2 = (ulong)(((chan_conf >> 4) - (chan_conf & 0xfffffff0)) + chan_conf) *
            (ulong)samples * *(long *)(&DAT_001120d0 + (ulong)depth * 8);
    switch((ulong)depth) {
    default:
      memset(buf,0,uVar2);
      return;
    case 4:
    case 5:
    case 6:
    case 7:
      break;
    case 8:
      memset(buf,0x80,uVar2);
      return;
    case 9:
      if (1 < uVar2) {
        lVar3 = (uVar2 >> 1) + (ulong)(uVar2 >> 1 == 0);
        lVar4 = lVar3 + -1;
        auVar5._8_4_ = (int)lVar4;
        auVar5._0_8_ = lVar4;
        auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
        uVar2 = 0;
        auVar5 = auVar5 ^ _DAT_00112020;
        auVar12._8_4_ = 0xffffffff;
        auVar12._0_8_ = 0xffffffffffffffff;
        auVar12._12_4_ = 0xffffffff;
        auVar13 = _DAT_00112040;
        auVar9 = _DAT_00112050;
        auVar10 = _DAT_00112000;
        auVar11 = _DAT_00112010;
        do {
          auVar14 = auVar11 ^ auVar1;
          iVar26 = auVar5._0_4_;
          iVar25 = -(uint)(iVar26 < auVar14._0_4_);
          iVar7 = auVar5._4_4_;
          auVar15._4_4_ = -(uint)(iVar7 < auVar14._4_4_);
          iVar30 = auVar5._8_4_;
          iVar29 = -(uint)(iVar30 < auVar14._8_4_);
          iVar8 = auVar5._12_4_;
          auVar15._12_4_ = -(uint)(iVar8 < auVar14._12_4_);
          auVar22._4_4_ = iVar25;
          auVar22._0_4_ = iVar25;
          auVar22._8_4_ = iVar29;
          auVar22._12_4_ = iVar29;
          auVar31 = pshuflw(in_XMM11,auVar22,0xe8);
          auVar17._4_4_ = -(uint)(auVar14._4_4_ == iVar7);
          auVar17._12_4_ = -(uint)(auVar14._12_4_ == iVar8);
          auVar17._0_4_ = auVar17._4_4_;
          auVar17._8_4_ = auVar17._12_4_;
          auVar6 = pshuflw(in_XMM12,auVar17,0xe8);
          auVar15._0_4_ = auVar15._4_4_;
          auVar15._8_4_ = auVar15._12_4_;
          auVar14 = pshuflw(auVar31,auVar15,0xe8);
          auVar14 = (auVar14 | auVar6 & auVar31) ^ auVar12;
          auVar14 = packssdw(auVar14,auVar14);
          if ((auVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)buf + uVar2 * 2) = 0x8000;
          }
          auVar15 = auVar17 & auVar22 | auVar15;
          auVar14 = packssdw(auVar15,auVar15);
          auVar14 = packssdw(auVar14 ^ auVar12,auVar14 ^ auVar12);
          if ((auVar14._0_4_ >> 0x10 & 1) != 0) {
            *(undefined2 *)((long)buf + uVar2 * 2 + 2) = 0x8000;
          }
          auVar14 = auVar10 ^ auVar1;
          iVar25 = -(uint)(iVar26 < auVar14._0_4_);
          auVar27._4_4_ = -(uint)(iVar7 < auVar14._4_4_);
          iVar29 = -(uint)(iVar30 < auVar14._8_4_);
          auVar27._12_4_ = -(uint)(iVar8 < auVar14._12_4_);
          auVar16._4_4_ = iVar25;
          auVar16._0_4_ = iVar25;
          auVar16._8_4_ = iVar29;
          auVar16._12_4_ = iVar29;
          auVar21._4_4_ = -(uint)(auVar14._4_4_ == iVar7);
          auVar21._12_4_ = -(uint)(auVar14._12_4_ == iVar8);
          auVar21._0_4_ = auVar21._4_4_;
          auVar21._8_4_ = auVar21._12_4_;
          auVar27._0_4_ = auVar27._4_4_;
          auVar27._8_4_ = auVar27._12_4_;
          auVar14 = auVar21 & auVar16 | auVar27;
          auVar14 = packssdw(auVar14,auVar14);
          auVar14 = packssdw(auVar14 ^ auVar12,auVar14 ^ auVar12);
          if ((auVar14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)buf + uVar2 * 2 + 4) = 0x8000;
          }
          auVar17 = pshufhw(auVar16,auVar16,0x84);
          auVar22 = pshufhw(auVar21,auVar21,0x84);
          auVar15 = pshufhw(auVar17,auVar27,0x84);
          auVar17 = (auVar15 | auVar22 & auVar17) ^ auVar12;
          auVar17 = packssdw(auVar17,auVar17);
          if ((auVar17 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)buf + uVar2 * 2 + 6) = 0x8000;
          }
          auVar17 = auVar9 ^ auVar1;
          iVar25 = -(uint)(iVar26 < auVar17._0_4_);
          auVar19._4_4_ = -(uint)(iVar7 < auVar17._4_4_);
          iVar29 = -(uint)(iVar30 < auVar17._8_4_);
          auVar19._12_4_ = -(uint)(iVar8 < auVar17._12_4_);
          auVar23._4_4_ = iVar25;
          auVar23._0_4_ = iVar25;
          auVar23._8_4_ = iVar29;
          auVar23._12_4_ = iVar29;
          auVar14 = pshuflw(auVar14,auVar23,0xe8);
          auVar18._4_4_ = -(uint)(auVar17._4_4_ == iVar7);
          auVar18._12_4_ = -(uint)(auVar17._12_4_ == iVar8);
          auVar18._0_4_ = auVar18._4_4_;
          auVar18._8_4_ = auVar18._12_4_;
          auVar31 = pshuflw(auVar6 & auVar31,auVar18,0xe8);
          in_XMM12 = auVar31 & auVar14;
          auVar19._0_4_ = auVar19._4_4_;
          auVar19._8_4_ = auVar19._12_4_;
          auVar14 = pshuflw(auVar14,auVar19,0xe8);
          auVar14 = (auVar14 | in_XMM12) ^ auVar12;
          auVar14 = packssdw(auVar14,auVar14);
          if ((auVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)buf + uVar2 * 2 + 8) = 0x8000;
          }
          auVar19 = auVar18 & auVar23 | auVar19;
          auVar14 = packssdw(auVar19,auVar19);
          auVar14 = packssdw(auVar14 ^ auVar12,auVar14 ^ auVar12);
          if ((auVar14 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)buf + uVar2 * 2 + 10) = 0x8000;
          }
          auVar14 = auVar13 ^ auVar1;
          iVar26 = -(uint)(iVar26 < auVar14._0_4_);
          auVar28._4_4_ = -(uint)(iVar7 < auVar14._4_4_);
          iVar30 = -(uint)(iVar30 < auVar14._8_4_);
          auVar28._12_4_ = -(uint)(iVar8 < auVar14._12_4_);
          auVar20._4_4_ = iVar26;
          auVar20._0_4_ = iVar26;
          auVar20._8_4_ = iVar30;
          auVar20._12_4_ = iVar30;
          auVar24._4_4_ = -(uint)(auVar14._4_4_ == iVar7);
          auVar24._12_4_ = -(uint)(auVar14._12_4_ == iVar8);
          auVar24._0_4_ = auVar24._4_4_;
          auVar24._8_4_ = auVar24._12_4_;
          auVar28._0_4_ = auVar28._4_4_;
          auVar28._8_4_ = auVar28._12_4_;
          auVar14 = auVar24 & auVar20 | auVar28;
          auVar14 = packssdw(auVar14,auVar14);
          in_XMM11 = packssdw(auVar14 ^ auVar12,auVar14 ^ auVar12);
          if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)buf + uVar2 * 2 + 0xc) = 0x8000;
          }
          auVar14 = pshufhw(auVar20,auVar20,0x84);
          auVar6 = pshufhw(auVar24,auVar24,0x84);
          auVar31 = pshufhw(auVar14,auVar28,0x84);
          auVar14 = (auVar31 | auVar6 & auVar14) ^ auVar12;
          auVar14 = packssdw(auVar14,auVar14);
          if ((auVar14 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)((long)buf + uVar2 * 2 + 0xe) = 0x8000;
          }
          uVar2 = uVar2 + 8;
          lVar4 = auVar11._8_8_;
          auVar11._0_8_ = auVar11._0_8_ + 8;
          auVar11._8_8_ = lVar4 + 8;
          lVar4 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 8;
          auVar10._8_8_ = lVar4 + 8;
          lVar4 = auVar9._8_8_;
          auVar9._0_8_ = auVar9._0_8_ + 8;
          auVar9._8_8_ = lVar4 + 8;
          lVar4 = auVar13._8_8_;
          auVar13._0_8_ = auVar13._0_8_ + 8;
          auVar13._8_8_ = lVar4 + 8;
        } while ((lVar3 + 7U & 0xfffffffffffffff8) != uVar2);
      }
      break;
    case 10:
      if (3 < uVar2) {
        lVar3 = (uVar2 >> 2) + (ulong)(uVar2 >> 2 == 0);
        lVar4 = lVar3 + -1;
        auVar6._8_4_ = (int)lVar4;
        auVar6._0_8_ = lVar4;
        auVar6._12_4_ = (int)((ulong)lVar4 >> 0x20);
        uVar2 = 0;
        auVar6 = auVar6 ^ _DAT_00112020;
        auVar14 = _DAT_00112000;
        auVar31 = _DAT_00112010;
        do {
          auVar13 = auVar31 ^ auVar1;
          iVar26 = auVar6._4_4_;
          if ((bool)(~(auVar13._4_4_ == iVar26 && auVar6._0_4_ < auVar13._0_4_ ||
                      iVar26 < auVar13._4_4_) & 1)) {
            *(undefined4 *)((long)buf + uVar2 * 4) = 0x800000;
          }
          if ((auVar13._12_4_ != auVar6._12_4_ || auVar13._8_4_ <= auVar6._8_4_) &&
              auVar13._12_4_ <= auVar6._12_4_) {
            *(undefined4 *)((long)buf + uVar2 * 4 + 4) = 0x800000;
          }
          iVar7 = SUB164(auVar14 ^ auVar1,4);
          if (iVar7 <= iVar26 && (iVar7 != iVar26 || SUB164(auVar14 ^ auVar1,0) <= auVar6._0_4_)) {
            *(undefined4 *)((long)buf + uVar2 * 4 + 8) = 0x800000;
            *(undefined4 *)((long)buf + uVar2 * 4 + 0xc) = 0x800000;
          }
          uVar2 = uVar2 + 4;
          lVar4 = auVar31._8_8_;
          auVar31._0_8_ = auVar31._0_8_ + 4;
          auVar31._8_8_ = lVar4 + 4;
          lVar4 = auVar14._8_8_;
          auVar14._0_8_ = auVar14._0_8_ + 4;
          auVar14._8_8_ = lVar4 + 4;
        } while ((lVar3 + 3U & 0x7ffffffffffffffc) != uVar2);
      }
    }
  }
  return;
}

Assistant:

void al_fill_silence(void *buf, unsigned int samples,
   ALLEGRO_AUDIO_DEPTH depth, ALLEGRO_CHANNEL_CONF chan_conf)
{
   size_t bytes = samples * al_get_audio_depth_size(depth) *
      al_get_channel_count(chan_conf);

   switch (depth) {
      case ALLEGRO_AUDIO_DEPTH_INT8:
      case ALLEGRO_AUDIO_DEPTH_INT16:
      case ALLEGRO_AUDIO_DEPTH_INT24:
      case ALLEGRO_AUDIO_DEPTH_FLOAT32:
         memset(buf, 0, bytes);
         break;
      case ALLEGRO_AUDIO_DEPTH_UINT8:
         memset(buf, 0x80, bytes);
         break;
      case ALLEGRO_AUDIO_DEPTH_UINT16:
         {
            uint16_t *buffer = buf;
            size_t n = bytes / sizeof(uint16_t);
            size_t i;

            for (i = 0; i < n; i++)
               buffer[i] = 0x8000;
         }
         break;
      case ALLEGRO_AUDIO_DEPTH_UINT24:
         {
            uint32_t *buffer = buf;
            size_t n = bytes / sizeof(uint32_t);
            size_t i;

            for (i = 0; i < n; i++)
               buffer[i] = 0x800000;
         }
         break;
      default:
         ASSERT(false);
         break;
   }
}